

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O3

void fetch_radial_gradient(uint32_t *buffer,Operator *op,VSpanData *data,int y,int x,int length)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Spread SVar3;
  uint uVar4;
  uint uVar5;
  uint32_t *puVar6;
  uint32_t uVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  fVar13 = (op->field_4).radial.a;
  if (ABS(fVar13) <= 1e-06) {
    memfill32(buffer,0,length);
    return;
  }
  fVar11 = (float)y + 0.5;
  fVar9 = data->m11;
  fVar10 = data->m12;
  fVar12 = (float)x + 0.5;
  fVar16 = fVar9 * fVar12 + data->m21 * fVar11 + data->dx;
  fVar14 = fVar10 * fVar12 + data->m22 * fVar11 + data->dy;
  fVar17 = data->m13;
  if ((fVar17 != 0.0) || (NAN(fVar17))) {
    puVar6 = buffer + length;
  }
  else {
    puVar6 = buffer + length;
    if ((data->m23 == 0.0) && (!NAN(data->m23))) {
      fVar16 = fVar16 - (data->mGradient).field_1.linear.x2;
      fVar14 = fVar14 - (data->mGradient).field_1.linear.y2;
      fVar12 = 1.0 / (fVar13 + fVar13);
      fVar17 = (op->field_4).linear.dx;
      fVar11 = (op->field_4).linear.dy;
      fVar15 = fVar14 * fVar11 +
               (op->field_4).linear.l * (data->mGradient).field_1.radial.fradius + fVar16 * fVar17;
      fVar15 = fVar15 + fVar15;
      fVar11 = fVar17 * fVar9 + fVar11 * fVar10;
      fVar11 = fVar11 + fVar11;
      fVar18 = fVar12 * fVar15;
      fVar17 = fVar9 * fVar9 + fVar10 * fVar10;
      fVar10 = fVar14 * fVar10 + fVar16 * fVar9;
      fVar9 = fVar12 * fVar12;
      fVar13 = fVar13 * 4.0;
      fVar14 = (fVar15 * fVar15 -
               ((op->field_4).linear.off - (fVar16 * fVar16 + fVar14 * fVar14)) * fVar13) * fVar9;
      fVar10 = ((fVar10 + fVar10 + fVar17) * fVar13 + fVar11 * fVar11 + (fVar15 + fVar15) * fVar11)
               * fVar9;
      fVar9 = (fVar13 * (fVar17 + fVar17) + (fVar11 + fVar11) * fVar11) * fVar9;
      if ((op->field_4).radial.extended == false) {
        if (length < 1) {
          return;
        }
        do {
          if (fVar14 < 0.0) {
            fVar13 = sqrtf(fVar14);
          }
          else {
            fVar13 = SQRT(fVar14);
          }
          SVar3 = (data->mGradient).mSpread;
          uVar4 = (uint)((fVar13 - fVar18) * 1023.0 + 0.5);
          if (SVar3 == Reflect) {
            uVar4 = uVar4 & 0x7ff;
            if (0x3ff < uVar4) {
              uVar4 = uVar4 ^ 0x7ff;
            }
          }
          else if (SVar3 == Repeat) {
            uVar4 = uVar4 & 0x3ff;
          }
          else if ((int)uVar4 < 0) {
            uVar4 = 0;
          }
          else if (0x3fe < uVar4) {
            uVar4 = 0x3ff;
          }
          *buffer = (data->mGradient).mColorTable[uVar4];
          buffer = buffer + 1;
          fVar14 = fVar14 + fVar10;
          fVar10 = fVar10 + fVar9;
          fVar18 = fVar18 + fVar12 * fVar11;
        } while (buffer < puVar6);
        return;
      }
      if (length < 1) {
        return;
      }
      do {
        uVar7 = 0;
        if (fVar14 >= 0.0) {
          if (fVar14 < 0.0) {
            fVar13 = sqrtf(fVar14);
          }
          else {
            fVar13 = SQRT(fVar14);
          }
          uVar7 = 0;
          if (0.0 <= (op->field_4).linear.l * (fVar13 - fVar18) +
                     (data->mGradient).field_1.radial.fradius) {
            SVar3 = (data->mGradient).mSpread;
            uVar4 = (uint)((fVar13 - fVar18) * 1023.0 + 0.5);
            if (SVar3 == Reflect) {
              uVar4 = uVar4 & 0x7ff;
              uVar5 = uVar4 ^ 0x7ff;
              bVar8 = uVar4 < 0x400;
LAB_0010f54a:
              if (!bVar8) {
                uVar4 = uVar5;
              }
            }
            else if (SVar3 == Repeat) {
              uVar4 = uVar4 & 0x3ff;
            }
            else {
              if (-1 < (int)uVar4) {
                uVar5 = 0x3ff;
                bVar8 = uVar4 < 0x3ff;
                goto LAB_0010f54a;
              }
              uVar4 = 0;
            }
            uVar7 = (data->mGradient).mColorTable[uVar4];
          }
        }
        *buffer = uVar7;
        fVar14 = fVar14 + fVar10;
        fVar10 = fVar10 + fVar9;
        fVar18 = fVar18 + fVar12 * fVar11;
        buffer = buffer + 1;
        if (puVar6 <= buffer) {
          return;
        }
      } while( true );
    }
  }
  if (buffer < puVar6) {
    fVar13 = fVar17 * fVar12 + fVar11 * data->m23 + data->m33;
    do {
      uVar7 = 0;
      if ((fVar13 != 0.0) || (NAN(fVar13))) {
        fVar9 = fVar16 * (1.0 / fVar13) - (data->mGradient).field_1.linear.x2;
        fVar10 = (1.0 / fVar13) * fVar14 - (data->mGradient).field_1.linear.y2;
        fVar17 = (op->field_4).linear.dy * fVar10 +
                 (op->field_4).linear.l * (data->mGradient).field_1.radial.fradius +
                 (op->field_4).linear.dx * fVar9;
        fVar17 = fVar17 + fVar17;
        fVar9 = fVar17 * fVar17 +
                (op->field_4).radial.a * -4.0 *
                ((op->field_4).linear.off - (fVar9 * fVar9 + fVar10 * fVar10));
        if (fVar9 >= 0.0) {
          if (fVar9 < 0.0) {
            fVar9 = sqrtf(fVar9);
          }
          else {
            fVar9 = SQRT(fVar9);
          }
          fVar10 = (op->field_4).radial.inv2a;
          fVar11 = (-fVar17 - fVar9) * fVar10;
          fVar10 = (fVar9 - fVar17) * fVar10;
          if (fVar10 <= fVar11) {
            fVar10 = fVar11;
          }
          uVar7 = 0;
          if (0.0 <= (op->field_4).linear.l * fVar10 + (data->mGradient).field_1.radial.fradius) {
            SVar3 = (data->mGradient).mSpread;
            uVar4 = (uint)(fVar10 * 1023.0 + 0.5);
            if (SVar3 == Reflect) {
              uVar4 = uVar4 & 0x7ff;
              uVar5 = uVar4 ^ 0x7ff;
              bVar8 = uVar4 < 0x400;
LAB_0010f2e0:
              if (!bVar8) {
                uVar4 = uVar5;
              }
            }
            else if (SVar3 == Repeat) {
              uVar4 = uVar4 & 0x3ff;
            }
            else {
              if (-1 < (int)uVar4) {
                uVar5 = 0x3ff;
                bVar8 = uVar4 < 0x3ff;
                goto LAB_0010f2e0;
              }
              uVar4 = 0;
            }
            uVar7 = (data->mGradient).mColorTable[uVar4];
          }
        }
      }
      *buffer = uVar7;
      fVar16 = fVar16 + data->m11;
      uVar1 = data->m12;
      uVar2 = data->m13;
      fVar14 = fVar14 + (float)uVar1;
      fVar13 = fVar13 + (float)uVar2;
      buffer = buffer + 1;
    } while (buffer < puVar6);
  }
  return;
}

Assistant:

void fetch_radial_gradient(uint32_t *buffer, const Operator *op,
                           const VSpanData *data, int y, int x, int length)
{
    // avoid division by zero
    if (vIsZero(op->radial.a)) {
        memfill32(buffer, 0, length);
        return;
    }

    float rx =
        data->m21 * (y + float(0.5)) + data->dx + data->m11 * (x + float(0.5));
    float ry =
        data->m22 * (y + float(0.5)) + data->dy + data->m12 * (x + float(0.5));
    bool affine = !data->m13 && !data->m23;

    uint32_t *end = buffer + length;
    if (affine) {
        rx -= data->mGradient.radial.fx;
        ry -= data->mGradient.radial.fy;

        float inv_a = 1 / float(2 * op->radial.a);

        const float delta_rx = data->m11;
        const float delta_ry = data->m12;

        float b = 2 * (op->radial.dr * data->mGradient.radial.fradius +
                       rx * op->radial.dx + ry * op->radial.dy);
        float delta_b =
            2 * (delta_rx * op->radial.dx + delta_ry * op->radial.dy);
        const float b_delta_b = 2 * b * delta_b;
        const float delta_b_delta_b = 2 * delta_b * delta_b;

        const float bb = b * b;
        const float delta_bb = delta_b * delta_b;

        b *= inv_a;
        delta_b *= inv_a;

        const float rxrxryry = rx * rx + ry * ry;
        const float delta_rxrxryry = delta_rx * delta_rx + delta_ry * delta_ry;
        const float rx_plus_ry = 2 * (rx * delta_rx + ry * delta_ry);
        const float delta_rx_plus_ry = 2 * delta_rxrxryry;

        inv_a *= inv_a;

        float det =
            (bb - 4 * op->radial.a * (op->radial.sqrfr - rxrxryry)) * inv_a;
        float delta_det = (b_delta_b + delta_bb +
                           4 * op->radial.a * (rx_plus_ry + delta_rxrxryry)) *
                          inv_a;
        const float delta_delta_det =
            (delta_b_delta_b + 4 * op->radial.a * delta_rx_plus_ry) * inv_a;

        fetch(buffer, end, op, data, det, delta_det, delta_delta_det, b,
              delta_b);
    } else {
        float rw = data->m23 * (y + float(0.5)) + data->m33 +
                   data->m13 * (x + float(0.5));

        while (buffer < end) {
            if (rw == 0) {
                *buffer = 0;
            } else {
                float invRw = 1 / rw;
                float gx = rx * invRw - data->mGradient.radial.fx;
                float gy = ry * invRw - data->mGradient.radial.fy;
                float b = 2 * (op->radial.dr * data->mGradient.radial.fradius +
                               gx * op->radial.dx + gy * op->radial.dy);
                float det = radialDeterminant(
                    op->radial.a, b, op->radial.sqrfr - (gx * gx + gy * gy));

                uint32_t result = 0;
                if (det >= 0) {
                    float detSqrt = std::sqrt(det);

                    float s0 = (-b - detSqrt) * op->radial.inv2a;
                    float s1 = (-b + detSqrt) * op->radial.inv2a;

                    float s = vMax(s0, s1);

                    if (data->mGradient.radial.fradius + op->radial.dr * s >= 0)
                        result = gradientPixel(&data->mGradient, s);
                }

                *buffer = result;
            }

            rx += data->m11;
            ry += data->m12;
            rw += data->m13;

            ++buffer;
        }
    }
}